

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

uint32 __thiscall
Clasp::Solver::simplifyConflictClause(Solver *this,LitVec *cc,ConstraintInfo *info,ClauseHead *rhs)

{
  WeightLitVec *this_00;
  uint *puVar1;
  pointer pDVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  pointer pLVar6;
  iterator ppVar7;
  uint32 uVar8;
  size_type sVar9;
  uint uVar10;
  ClauseHead *pCVar11;
  uint32 maxLevel;
  uint uVar12;
  pointer puVar13;
  iterator first;
  long lVar14;
  long *plVar15;
  ulong uVar16;
  Antecedent ante;
  
  (this->temp_).ebo_.size = 0;
  uVar8 = ccMinimize(this,cc,&this->temp_,SUB84(this->strategy_,4) >> 9 & 3,this->ccMin_);
  if ((cc->ebo_).size < 2) {
    puVar13 = (this->assign_).assign_.ebo_.buf;
    maxLevel = 0;
  }
  else {
    puVar13 = (this->assign_).assign_.ebo_.buf;
    maxLevel = *(uint *)((long)puVar13 + (ulong)((cc->ebo_).buf[1].rep_ & 0xfffffffc)) >> 4;
  }
  uVar12 = (this->temp_).ebo_.size;
  pLVar6 = (this->temp_).ebo_.buf;
  for (uVar16 = 0; uVar12 != uVar16; uVar16 = uVar16 + 1) {
    puVar1 = (uint *)((long)puVar13 + (ulong)(pLVar6[uVar16].rep_ & 0xfffffffc));
    *puVar1 = *puVar1 & 0xfffffff3;
  }
  if (uVar8 == 1) {
    switch(SUB84(this->strategy_,4) >> 3 & 3) {
    case 0:
      goto switchD_001647aa_caseD_0;
    case 1:
      uVar8 = 1;
      break;
    case 2:
      uVar8 = (cc->ebo_).size >> 1;
      break;
    case 3:
      uVar8 = 0xffffffff;
    }
    pLVar6 = (cc->ebo_).buf;
    puVar1 = (uint *)((long)puVar13 + (ulong)(pLVar6->rep_ & 0xfffffffc));
    *puVar1 = *puVar1 | 0xc;
    ante = ccHasReverseArc(this,(Literal)pLVar6[1].rep_,maxLevel,uVar8);
    if (ante.data_ != 0) {
      (this->conflict_).ebo_.size = 0;
      Antecedent::reason(&ante,this,(Literal)((cc->ebo_).buf[1].rep_ & 0xfffffffe ^ 2),
                         &this->conflict_);
      ccResolve(this,cc,1,&this->conflict_);
    }
    puVar1 = (uint *)((long)(this->assign_).assign_.ebo_.buf +
                     (ulong)(((cc->ebo_).buf)->rep_ & 0xfffffffc));
    *puVar1 = *puVar1 & 0xfffffff3;
  }
switchD_001647aa_caseD_0:
  if (rhs != (ClauseHead *)0x0) {
    (this->conflict_).ebo_.size = 0;
    (*(rhs->super_Constraint)._vptr_Constraint[0x14])(rhs,&this->conflict_);
    sVar9 = (cc->ebo_).size;
    puVar13 = (this->assign_).assign_.ebo_.buf;
    puVar1 = (uint *)((long)puVar13 + (ulong)(((cc->ebo_).buf)->rep_ & 0xfffffffc));
    *puVar1 = *puVar1 | 0xc;
    lVar14 = 0;
    for (; ((ulong)(this->conflict_).ebo_.size << 2 != lVar14 && (sVar9 != 0));
        sVar9 = sVar9 - ((uVar12 & 0xc) != 0 && 0xf < uVar12)) {
      uVar12 = *(uint *)((long)puVar13 +
                        (ulong)(*(uint *)((long)&((this->conflict_).ebo_.buf)->rep_ + lVar14) &
                               0xfffffffc));
      lVar14 = lVar14 + 4;
    }
    if (((sVar9 == 0) && (pCVar11 = otfsRemove(this,rhs,cc), pCVar11 != (ClauseHead *)0x0)) &&
       (uVar12 = (this->conflict_).ebo_.size, (this->cc_).ebo_.size < uVar12)) {
      pLVar6 = (this->conflict_).ebo_.buf;
      uVar10 = 1;
      lVar14 = 0;
      while (((ulong)uVar12 << 2 != lVar14 && ((uVar10 & 1) != 0))) {
        uVar4 = *(uint *)((long)&pLVar6->rep_ + lVar14);
        uVar5 = *(uint *)((long)(this->assign_).assign_.ebo_.buf + (ulong)(uVar4 & 0xfffffffc));
        uVar10 = 1;
        if (uVar5 < 0x10 || (uVar5 & 0xc) == 0) {
          uVar10 = (*(pCVar11->super_Constraint)._vptr_Constraint[0x16])
                             (pCVar11,this,(ulong)uVar4,0);
        }
        lVar14 = lVar14 + 4;
      }
    }
    puVar1 = (uint *)((long)(this->assign_).assign_.ebo_.buf +
                     (ulong)(((cc->ebo_).buf)->rep_ & 0xfffffffc));
    *puVar1 = *puVar1 & 0xfffffff3;
  }
  uVar10 = SUB84(this->strategy_,0) & 0xffff;
  uVar12 = (this->levels_).super_type.ebo_.size + 1;
  if (uVar12 < uVar10) {
    uVar12 = uVar10;
  }
  uVar8 = 0;
  if (uVar12 <= (cc->ebo_).size) {
    uVar8 = SUB84(this->strategy_,4) >> 0xb & 3;
  }
  uVar8 = finalizeConflictClause(this,cc,info,uVar8);
  uVar16 = (ulong)(this->bumpAct_).ebo_.size;
  if (uVar16 != 0) {
    this_00 = &this->bumpAct_;
    uVar12 = (info->super_ConstraintScore).rep;
    uVar10 = 0x7f;
    if ((uVar12 & 0x7f00000) != 0) {
      uVar10 = uVar12 >> 0x14 & 0x7f;
    }
    ppVar7 = (this_00->ebo_).buf;
    first = ppVar7;
    for (lVar14 = 0; uVar16 << 3 != lVar14; lVar14 = lVar14 + 8) {
      iVar3 = *(int *)((long)&ppVar7->second + lVar14);
      if (iVar3 < (int)uVar10) {
        *(uint *)((long)&ppVar7->second + lVar14) = (iVar3 < 3) + 1;
        (first->first).rep_ = *(uint32 *)((long)&(ppVar7->first).rep_ + lVar14);
        first->second = *(int *)((long)&ppVar7->second + lVar14);
        first = first + 1;
      }
    }
    bk_lib::
    pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>::
    erase(this_00,first,ppVar7 + (this->bumpAct_).ebo_.size);
    plVar15 = (long *)((this->heuristic_).ptr_ & 0xfffffffffffffffe);
    (**(code **)(*plVar15 + 0x58))(0x3ff0000000000000,plVar15,this,this_00);
  }
  (this->bumpAct_).ebo_.size = 0;
  uVar12 = (this->temp_).ebo_.size;
  for (uVar16 = 0; uVar12 != uVar16; uVar16 = uVar16 + 1) {
    pDVar2 = (this->levels_).super_type.ebo_.buf +
             ((*(uint *)((long)(this->assign_).assign_.ebo_.buf +
                        (ulong)((this->temp_).ebo_.buf[uVar16].rep_ & 0xfffffffc)) >> 4) - 1);
    *(uint *)pDVar2 = *(uint *)pDVar2 & 0xbfffffff;
  }
  (this->temp_).ebo_.size = 0;
  return uVar8;
}

Assistant:

uint32 Solver::simplifyConflictClause(LitVec& cc, ConstraintInfo& info, ClauseHead* rhs) {
	// 1. remove redundant literals from conflict clause
	temp_.clear();
	uint32 onAssert = ccMinimize(cc, temp_, strategy_.ccMinAntes, ccMin_);
	uint32 jl       = cc.size() > 1 ? level(cc[1].var()) : 0;
	// clear seen flags of removed literals - keep levels marked
	for (LitVec::size_type x = 0, stop = temp_.size(); x != stop; ++x) {
		clearSeen(temp_[x].var());
	}
	// 2. check for inverse arcs
	if (onAssert == 1 && strategy_.reverseArcs > 0) {
		uint32 maxN = (uint32)strategy_.reverseArcs;
		if      (maxN > 2) maxN = UINT32_MAX;
		else if (maxN > 1) maxN = static_cast<uint32>(cc.size() / 2);
		markSeen(cc[0].var());
		Antecedent ante = ccHasReverseArc(cc[1], jl, maxN);
		if (!ante.isNull()) {
			// resolve with inverse arc
			conflict_.clear();
			ante.reason(*this, ~cc[1], conflict_);
			ccResolve(cc, 1, conflict_);
		}
		clearSeen(cc[0].var());
	}
	// 3. check if final clause subsumes rhs
	if (rhs) {
		conflict_.clear();
		rhs->toLits(conflict_);
		uint32 open   = (uint32)cc.size();
		markSeen(cc[0].var());
		for (LitVec::const_iterator it = conflict_.begin(), end = conflict_.end(); it != end && open; ++it) {
			// NOTE: at this point the DB might not be fully simplified,
			//       e.g. because of mt or lookahead, hence we must explicitly
			//       check for literals assigned on DL 0
			open -= level(it->var()) > 0 && seen(it->var());
		}
		rhs = open ? 0 : otfsRemove(rhs, &cc);
		if (rhs) { // rhs is subsumed by cc but could not be removed.
			// TODO: we could reuse rhs instead of learning cc
			//       but this would complicate the calling code.
			ClauseHead::BoolPair r(true, false);
			if (cc_.size() < conflict_.size()) {
				//     For now, we only try to strengthen rhs.
				for (LitVec::const_iterator it = conflict_.begin(), end = conflict_.end(); it != end && r.first; ++it) {
					if (!seen(it->var()) || level(it->var()) == 0) {
						r = rhs->strengthen(*this, *it, false);
					}
				}
				if (!r.first) { rhs = 0; }
			}
		}
		clearSeen(cc[0].var());
	}
	// 4. finalize
	uint32 repMode = cc.size() < std::max(strategy_.compress, decisionLevel()+1) ? 0 : strategy_.ccRepMode;
	jl = finalizeConflictClause(cc, info, repMode);
	// 5. bump vars implied by learnt constraints with small lbd
	if (!bumpAct_.empty()) {
		WeightLitVec::iterator j = bumpAct_.begin();
		weight_t newLbd = info.lbd();
		for (WeightLitVec::iterator it = bumpAct_.begin(), end = bumpAct_.end(); it != end; ++it) {
			if (it->second < newLbd) {
				it->second = 1 + (it->second <= 2);
				*j++ = *it;
			}
		}
		bumpAct_.erase(j, bumpAct_.end());
		heuristic_->bump(*this, bumpAct_, 1.0);
	}
	bumpAct_.clear();
	// 6. clear level flags of redundant literals
	for (LitVec::size_type x = 0, stop = temp_.size(); x != stop; ++x) {
		unmarkLevel(level(temp_[x].var()));
	}
	temp_.clear();
	return jl;
}